

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O0

void do_cmd_buy(command_conflict *cmd)

{
  byte bVar1;
  loc_conflict grid;
  _Bool _Var2;
  wchar_t wVar3;
  uint32_t uVar4;
  store *store_00;
  object *dest;
  int local_9c;
  wchar_t i;
  store *store;
  char local_88 [4];
  wchar_t price;
  char o_name [80];
  object *known_obj;
  object *bought;
  object *obj;
  command_conflict *pcStack_10;
  wchar_t amt;
  command_conflict *cmd_local;
  
  grid.x = (player->grid).x;
  grid.y = (player->grid).y;
  pcStack_10 = cmd;
  store_00 = store_at((chunk *)cave,grid);
  if (store_00 == (store *)0x0) {
    msg("You cannot purchase items when not in a store.");
  }
  else {
    wVar3 = cmd_get_arg_item((command *)pcStack_10,"item",&bought);
    if (wVar3 == L'\0') {
      _Var2 = pile_contains(store_00->stock,bought);
      if (_Var2) {
        wVar3 = cmd_get_arg_number((command *)pcStack_10,"quantity",(int *)((long)&obj + 4));
        if (wVar3 == L'\0') {
          known_obj = object_new();
          object_copy_amt(known_obj,bought,obj._4_4_);
          bVar1 = known_obj->number;
          wVar3 = inven_carry_num(player,known_obj);
          if (wVar3 < (int)(uint)bVar1) {
            msg("You cannot carry that many items.");
            object_delete((chunk *)0x0,(chunk *)0x0,&known_obj);
          }
          else {
            object_desc(local_88,0x50,known_obj,0x43,player);
            wVar3 = price_item(store_00,known_obj,false,(uint)known_obj->number);
            if (player->au < wVar3) {
              msg("You cannot afford that purchase.");
              object_delete((chunk *)0x0,(chunk *)0x0,&known_obj);
            }
            else {
              player->au = player->au - wVar3;
              player->upkeep->update = player->upkeep->update | 0x400;
              player->upkeep->notice = player->upkeep->notice | 3;
              object_desc(local_88,0x50,known_obj,0x43,player);
              uVar4 = Rand_div(3);
              if (uVar4 == 0) {
                uVar4 = Rand_div(6);
                msgt(0x56,"%s",comment_accept[(int)uVar4]);
              }
              msg("You bought %s for %d gold.",local_88,(ulong)(uint)wVar3);
              known_obj->note = 0;
              if (known_obj->origin == '\0') {
                known_obj->origin = '\x10';
              }
              _Var2 = tval_can_have_charges(bought);
              if (_Var2) {
                bought->pval = bought->pval - known_obj->pval;
              }
              dest = object_new();
              object_copy(dest,bought->known);
              known_obj->known = dest;
              object_flavor_aware(player,known_obj);
              known_obj->known->effect = known_obj->effect;
              while (_Var2 = object_fully_known(known_obj), ((_Var2 ^ 0xffU) & 1) != 0) {
                object_learn_unknown_rune(player,known_obj,true);
                player_know_object(player,known_obj);
              }
              inven_carry(player,known_obj,true,true);
              handle_stuff(player);
              _Var2 = store_sale_should_reduce_stock(store_00,bought);
              if ((_Var2) && (store_delete(store_00,bought,obj._4_4_), store_00->stock_num == '\0'))
              {
                uVar4 = Rand_div((uint)z_info->store_shuffle);
                if (uVar4 == 0) {
                  msg("The shopkeeper retires.");
                  store_shuffle(store_00);
                }
                else {
                  msg("The shopkeeper brings out some new stock.");
                }
                for (local_9c = 0; local_9c < 10; local_9c = local_9c + 1) {
                  store_maint(store_00);
                }
              }
              event_signal(EVENT_STORECHANGED);
              event_signal(EVENT_INVENTORY);
              event_signal(EVENT_EQUIPMENT);
            }
          }
        }
      }
      else {
        msg("You cannot buy that item because it\'s not in the store.");
      }
    }
  }
  return;
}

Assistant:

void do_cmd_buy(struct command *cmd)
{
	int amt;

	struct object *obj, *bought, *known_obj;

	char o_name[80];
	int price;

	struct store *store = store_at(cave, player->grid);

	if (!store) {
		msg("You cannot purchase items when not in a store.");
		return;
	}

	/* Get arguments */
	/* XXX-AS fill this out, split into cmd-store.c */
	if (cmd_get_arg_item(cmd, "item", &obj) != CMD_OK)
		return;

	if (!pile_contains(store->stock, obj)) {
		msg("You cannot buy that item because it's not in the store.");
		return;
	}

	if (cmd_get_arg_number(cmd, "quantity", &amt) != CMD_OK)
		return;

	/* Get desired object */
	bought = object_new();
	object_copy_amt(bought, obj, amt);

	/* Ensure we have room */
	if (bought->number > inven_carry_num(player, bought)) {
		msg("You cannot carry that many items.");
		object_delete(NULL, NULL, &bought);
		return;
	}

	/* Describe the object (fully) */
	object_desc(o_name, sizeof(o_name), bought, ODESC_PREFIX | ODESC_FULL,
		player);

	/* Extract the price for the entire stack */
	price = price_item(store, bought, false, bought->number);

	if (price > player->au) {
		msg("You cannot afford that purchase.");
		object_delete(NULL, NULL, &bought);
		return;
	}

	/* Spend the money */
	player->au -= price;

	/* Update the gear */
	player->upkeep->update |= (PU_INVEN);

	/* Combine the pack (later) */
	player->upkeep->notice |= (PN_COMBINE | PN_IGNORE);

	/* Describe the object (fully) again for the message */
	object_desc(o_name, sizeof(o_name), bought, ODESC_PREFIX | ODESC_FULL,
		player);

	/* Message */
	if (one_in_(3)) msgt(MSG_STORE5, "%s", ONE_OF(comment_accept));
	msg("You bought %s for %d gold.", o_name, price);

	/* Erase the inscription */
	bought->note = 0;

	/* Give it an origin if it doesn't have one */
	if (bought->origin == ORIGIN_NONE)
		bought->origin = ORIGIN_STORE;

	/* Hack - Reduce the number of charges in the original stack */
	if (tval_can_have_charges(obj))
		obj->pval -= bought->pval;

	/* Make a known object */
	known_obj = object_new();
	object_copy(known_obj, obj->known);
	bought->known = known_obj;

	/* Learn flavor, any effect and all the runes */
	object_flavor_aware(player, bought);
	bought->known->effect = bought->effect;
	while (!object_fully_known(bought)) {
		object_learn_unknown_rune(player, bought, true);
		player_know_object(player, bought);
	}

	/* Give it to the player */
	inven_carry(player, bought, true, true);

	/* Handle stuff */
	handle_stuff(player);

	/* Remove the bought objects from the store if it's not a readily
	 * replaced staple item */
	if (store_sale_should_reduce_stock(store, obj)) {
		/* Reduce or remove the item */
		store_delete(store, obj, amt);

		/* Store is empty */
		if (store->stock_num == 0) {
			int i;

			/* Sometimes shuffle the shopkeeper */
			if (one_in_(z_info->store_shuffle)) {
				/* Shuffle */
				msg("The shopkeeper retires.");
				store_shuffle(store);
			} else
				/* Maintain */
				msg("The shopkeeper brings out some new stock.");

			/* New inventory */
			for (i = 0; i < 10; ++i)
				store_maint(store);
		}
	}

	event_signal(EVENT_STORECHANGED);
	event_signal(EVENT_INVENTORY);
	event_signal(EVENT_EQUIPMENT);
}